

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_I0_scaled(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double r;
  double y;
  double local_18;
  
  local_18 = ABS(in_XMM0_Qa);
  dVar1 = sqrt(2.220446049250313e-16);
  if (dVar1 * 2.0 <= local_18) {
    if (3.0 < local_18) {
      if (8.0 < local_18) {
        dVar1 = xc_cheb_eval(16.0 / local_18 - 1.0,ai02_data,0x16);
        local_18 = sqrt(local_18);
        local_18 = (dVar1 + 0.375) / local_18;
      }
      else {
        dVar1 = xc_cheb_eval((48.0 / local_18 - 11.0) / 5.0,ai0_data,0x15);
        local_18 = sqrt(local_18);
        local_18 = (dVar1 + 0.375) / local_18;
      }
    }
    else {
      dVar1 = exp(-local_18);
      dVar2 = xc_cheb_eval((local_18 * local_18) / 4.5 - 1.0,bi0_data,0xc);
      local_18 = dVar1 * (dVar2 + 2.75);
    }
  }
  else {
    local_18 = 1.0 - local_18;
  }
  return local_18;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0_scaled(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0 - y;
  else if(y <= 3.0)
    r = exp(-y)*(2.75 + xc_cheb_eval(y*y/4.5-1.0, bi0_data, 12));
  else if(y <= 8.0)
    r = (.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai0_data, 21))/sqrt(y);
  else
    r = (.375 + xc_cheb_eval(16.0/y - 1.0, ai02_data, 22))/sqrt(y);

  return r;
}